

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# narrow.h
# Opt level: O0

long lf::base::narrow<long,unsigned_int>(uint from)

{
  stringstream ss;
  long to;
  uint from_local;
  
  return (ulong)from;
}

Assistant:

auto narrow(FROM from) noexcept -> TO {
  static_assert(std::is_arithmetic_v<TO>, "TO must be an arithmetic type");
  const TO to = static_cast<TO>(std::forward<FROM>(from));
  if constexpr (std::is_arithmetic_v<TO>) {
    LF_ASSERT_MSG(static_cast<FROM>(to) == from &&
                      (std::is_signed_v<FROM> == std::is_signed_v<TO> ||
                       ((to < TO{}) == (from < FROM{}))),
                  "Narrowing error.");
  } else {
    LF_ASSERT_MSG(static_cast<FROM>(to) == from, "Narrowing error.");
  }
  return to;
}